

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O3

void __thiscall
PrintC::buildTypeStack
          (PrintC *this,Datatype *ct,
          vector<const_Datatype_*,_std::allocator<const_Datatype_*>_> *typestack)

{
  pointer *pppDVar1;
  type_metatype tVar2;
  iterator __position;
  long *plVar3;
  Datatype *local_20;
  
  local_20 = ct;
  do {
    while( true ) {
      __position._M_current =
           (typestack->super__Vector_base<const_Datatype_*,_std::allocator<const_Datatype_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (typestack->super__Vector_base<const_Datatype_*,_std::allocator<const_Datatype_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Datatype_const*,std::allocator<Datatype_const*>>::
        _M_realloc_insert<Datatype_const*const&>
                  ((vector<Datatype_const*,std::allocator<Datatype_const*>> *)typestack,__position,
                   &local_20);
      }
      else {
        *__position._M_current = local_20;
        pppDVar1 = &(typestack->
                    super__Vector_base<const_Datatype_*,_std::allocator<const_Datatype_*>_>)._M_impl
                    .super__Vector_impl_data._M_finish;
        *pppDVar1 = *pppDVar1 + 1;
      }
      if ((local_20->name)._M_string_length != 0) {
        return;
      }
      tVar2 = local_20->metatype;
      if (tVar2 != TYPE_ARRAY) break;
LAB_002fff57:
      local_20 = (Datatype *)local_20[1]._vptr_Datatype;
    }
    if (tVar2 != TYPE_CODE) {
      if (tVar2 != TYPE_PTR) {
        return;
      }
      goto LAB_002fff57;
    }
    if (local_20[1]._vptr_Datatype == (_func_int **)0x0) {
      local_20 = &TypeFactory::getTypeVoid(((this->super_PrintLanguage).glb)->types)->super_Datatype
      ;
    }
    else {
      plVar3 = (long *)(**(code **)(*(long *)local_20[1]._vptr_Datatype[1] + 0x48))();
      local_20 = (Datatype *)(**(code **)(*plVar3 + 0x18))(plVar3);
    }
  } while( true );
}

Assistant:

void PrintC::buildTypeStack(const Datatype *ct,vector<const Datatype *> &typestack)

{
  for(;;) {
    typestack.push_back(ct);
    if (ct->getName().size() != 0)	// This can be a base type
      break;
    if (ct->getMetatype()==TYPE_PTR)
      ct = ((TypePointer *)ct)->getPtrTo();
    else if (ct->getMetatype()==TYPE_ARRAY)
      ct = ((TypeArray *)ct)->getBase();
    else if (ct->getMetatype()==TYPE_CODE) {
      const FuncProto *proto = ((TypeCode *)ct)->getPrototype();
      if (proto != (const FuncProto *)0)
	ct = proto->getOutputType();
      else
	ct = glb->types->getTypeVoid();
    }
    else
      break;			// Some other anonymous type
  }
}